

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetCompilePDBPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  string dir;
  string name;
  string local_78;
  string local_58;
  string local_38;
  
  GetCompilePDBDirectory(&local_78,this,config);
  GetCompilePDBName(&local_58,this,config);
  if (local_78._M_string_length == 0) {
    if (local_58._M_string_length != 0) {
      bVar1 = HaveWellDefinedOutputFiles(this);
      if (bVar1) {
        GetPDBDirectory(&local_38,this,config);
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (local_78._M_string_length == 0) goto LAB_0034765f;
  }
  std::__cxx11::string::append((char *)&local_78);
LAB_0034765f:
  std::operator+(__return_storage_ptr__,&local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCompilePDBPath(
  const std::string& config) const
{
  std::string dir = this->GetCompilePDBDirectory(config);
  std::string name = this->GetCompilePDBName(config);
  if (dir.empty() && !name.empty() && this->HaveWellDefinedOutputFiles()) {
    dir = this->GetPDBDirectory(config);
  }
  if (!dir.empty()) {
    dir += "/";
  }
  return dir + name;
}